

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_holder.hpp
# Opt level: O0

void __thiscall asio::detail::socket_holder::~socket_holder(socket_holder *this)

{
  noncopyable *in_RDI;
  state_type state;
  error_code ec;
  error_code local_18;
  
  if (*(int *)in_RDI != -1) {
    std::error_code::error_code(&local_18);
    socket_ops::close(*(int *)in_RDI);
  }
  noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

~socket_holder()
  {
    if (socket_ != invalid_socket)
    {
      asio::error_code ec;
      socket_ops::state_type state = 0;
      socket_ops::close(socket_, state, true, ec);
    }
  }